

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall SGParser::Generator::Lex::CreateRegExpGrammar(Lex *this,Grammar *grammar)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  *this_00;
  char *pcVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  mapped_type *pmVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_618;
  allocator<char> local_601;
  key_type local_600;
  allocator<char> local_5d9;
  String local_5d8;
  undefined1 local_5b8 [8];
  Production p;
  key_type local_4f0;
  ulong local_4d0;
  size_t j;
  uint arr [4];
  size_t i;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  productions;
  uint local_490 [27];
  uint local_424;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_80;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  grammarSymbols;
  Grammar *grammar_local;
  Lex *this_local;
  
  local_420 = &local_418;
  local_424 = 1;
  grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)grammar;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[8],_unsigned_int,_true>(local_420,(char (*) [8])"RegExp\'",&local_424);
  local_420 = &local_3f0;
  local_490[0x16] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_unsigned_int,_true>(local_420,(char (*) [7])"RegExp",local_490 + 0x16);
  local_420 = &local_3c8;
  local_490[0x15] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1a8ea9,local_490 + 0x15);
  local_420 = &local_3a0;
  local_490[0x14] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])"B",local_490 + 0x14);
  local_420 = &local_378;
  local_490[0x13] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1a9f54,local_490 + 0x13);
  local_420 = &local_350;
  local_490[0x12] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])"D",local_490 + 0x12);
  local_420 = &local_328;
  local_490[0x11] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aaa3d,local_490 + 0x11);
  local_420 = &local_300;
  local_490[0x10] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[8],_unsigned_int,_true>(local_420,(char (*) [8])0x1abb0e,local_490 + 0x10);
  local_420 = &local_2d8;
  local_490[0xf] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[9],_unsigned_int,_true>(local_420,(char (*) [9])0x1abaf7,local_490 + 0xf);
  local_420 = &local_2b0;
  local_490[0xe] = 0x80000065;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[10],_unsigned_int,_true>
            (local_420,(char (*) [10])"character",local_490 + 0xe);
  local_420 = &local_288;
  local_490[0xd] = 0x8000002d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa68f,local_490 + 0xd);
  local_420 = &local_260;
  local_490[0xc] = 0x80000041;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa748,local_490 + 0xc);
  local_420 = &local_238;
  local_490[0xb] = 0x80000030;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1ab391,local_490 + 0xb);
  local_420 = &local_210;
  local_490[10] = 0x8000007e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa74e,local_490 + 10);
  local_420 = &local_1e8;
  local_490[9] = 0x8000002c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa6bc,local_490 + 9);
  local_420 = &local_1c0;
  local_490[8] = 0x8000002a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa757,local_490 + 8);
  local_420 = &local_198;
  local_490[7] = 0x8000002b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1ab38d,local_490 + 7);
  local_420 = &local_170;
  local_490[6] = 0x8000005d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1ab63a,local_490 + 6);
  local_420 = &local_148;
  local_490[5] = 0x8000005f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa687,local_490 + 5);
  local_420 = &local_120;
  local_490[4] = 0x8000007d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1a90f0,local_490 + 4);
  local_420 = &local_f8;
  local_490[3] = 0x8000007f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])0x1aa754,local_490 + 3);
  local_420 = &local_d0;
  local_490[2] = 0x8000002f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])"-",local_490 + 2);
  local_420 = &local_a8;
  local_490[1] = 0x80000060;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])"^",local_490 + 1);
  local_420 = &local_80;
  local_490[0] = 0x80000026;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[2],_unsigned_int,_true>(local_420,(char (*) [2])"$",local_490);
  local_58 = &local_418;
  local_50 = 0x18;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             *)((long)&productions.
                       super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator(this_00);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_48,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&productions.
                super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)((long)&productions.
                          super__Vector_base<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  local_618 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
               *)&local_58;
  do {
    local_618 = local_618 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(local_618);
  } while (local_618 != &local_418);
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
          *)&i);
  arr[2] = 0;
  arr[3] = 0;
  for (; (ulong)arr._8_8_ < 0x14; arr._8_8_ = arr._8_8_ + 1) {
    for (local_4d0 = 0; local_4d0 < 4; local_4d0 = local_4d0 + 1) {
      if (*(long *)(arr._8_8_ * 0x38 + 0x1ed768 + local_4d0 * 8) != 0) {
        pcVar1 = *(char **)(arr._8_8_ * 0x38 + 0x1ed768 + local_4d0 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,pcVar1,
                   (allocator<char> *)
                   ((long)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)local_48,&local_4f0);
        arr[local_4d0 - 2] = *pmVar2;
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      }
    }
    pcVar1 = CreateRegExpGrammar::init[arr._8_8_].pName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,pcVar1,&local_5d9);
    pcVar1 = CreateRegExpGrammar::init[arr._8_8_].pSymbol;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,pcVar1,&local_601);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)local_48,&local_600);
    Production::Production
              ((Production *)local_5b8,&local_5d8,*pmVar2,(uint *)&j,
               CreateRegExpGrammar::init[arr._8_8_].Length,0,0);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
    push_back((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
               *)&i,(value_type *)local_5b8);
    Production::~Production((Production *)local_5b8);
  }
  Grammar::Clear((Grammar *)grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Grammar::AddGrammarSymbols
            ((Grammar *)grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_48);
  Grammar::AddProductions
            ((Grammar *)grammarSymbols._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
              *)&i);
  std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
  ~vector((vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
           *)&i);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_48);
  return;
}

Assistant:

void Lex::CreateRegExpGrammar(Grammar& grammar) const {
    // Define a grammar. Notice the first production is the "augment"
    // production. You've always got to have it since it tells the
    // parser the start symbol and creates an augmented grammar

    // RegExp'      -> RegExp
    // RegExp       -> RegExp A (concatenation operator is implicit)
    // RegExp       -> A

    // A            -> A '|' B
    // A            -> B

    // B            -> B '*'
    // B            -> B '+'
    // B            -> B '?'
    // B            -> C

    // C            -> '(' RegExp ')'
    // C            -> character
    // C            -> '.'
    // C            -> '[' GroupSet ']'
    // C            -> '[' '^' GroupSet ']'
    // C            -> '{' CharSet '}'

    // GroupSet     -> character '-' character
    // GroupSet     -> character
    // GroupSet     -> character '-' character GroupSet
    // GroupSet     -> character GroupSet

    // CharSet      -> character
    // CharSet      -> CharSet character

    // The terminals are . | * + $ - ^ { } ( ) [ ] character

    std::map<String, unsigned> grammarSymbols =
    {
        // Nonterminals (9 total)
        {"RegExp'",   1u},
        {"RegExp",    2u},
        {"A",         3u},
        {"B",         4u},
        {"C",         5u},
        {"D",         6u},
        {"E",         7u},
        {"CharSet",   8u},
        {"GroupSet",  9u},

        // Terminals (14 total)
        {"character", ('c' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"+",         ('+' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"?",         ('?' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {".",         ('.' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"|",         ('|' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"*",         ('*' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"(",         ('(' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {")",         (')' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"[",         ('[' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"]",         (']' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"{",         ('{' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"}",         ('}' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"-",         ('-' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"^",         ('^' + TokenCode::TokenFirstID) | ProductionMask::Terminal},
        {"$",         ('$' + TokenCode::TokenFirstID) | ProductionMask::Terminal}
    };

    // Productions structure
    static constexpr size_t productionCount = 20u;
    static constexpr struct
    {
        const char* pName;
        const char* pSymbol;
        unsigned    Length;
        const char* pRight[4u];
    }
    init[productionCount] =
    {
        {"RegExpConcat",             "RegExp",   2u, {"RegExp", "A"}                            }, // 0
        {"RegExp",                   "RegExp",   1u, {"A"}                                      }, // 1
        {"AOr",                      "A",        3u, {"A", "|", "B"}                            }, // 2
        {"A",                        "A",        1u, {"B"}                                      }, // 3
        {"BStar",                    "B",        2u, {"B", "*"}                                 }, // 4
        {"BPlus",                    "B",        2u, {"B", "+"}                                 }, // 5
        {"BQuestion",                "B",        2u, {"B", "?"}                                 }, // 6
        {"B",                        "B",        1u, {"C"}                                      }, // 7
        {"CParen",                   "C",        3u, {"(", "RegExp", ")"}                       }, // 8
        {"CChar",                    "C",        1u, {"character"}                              }, // 9
        {"CDot",                     "C",        1u, {"."}                                      }, // 10
        {"CGroupSet",                "C",        3u, {"[", "GroupSet", "]"}                     }, // 11
        {"CNotGroupSet",             "C",        4u, {"[", "^", "GroupSet", "]"}                }, // 12
        {"CCharSet",                 "C",        3u, {"{", "CharSet", "}"}                      }, // 13
        {"GroupSetChar",             "GroupSet", 1u, {"character"}                              }, // 14
        {"GroupSetCharGroupSet",     "GroupSet", 2u, {"character", "GroupSet"}                  }, // 15
        {"GroupSetCharList",         "GroupSet", 3u, {"character", "-", "character"}            }, // 16
        {"GroupSetCharListGroupSet", "GroupSet", 4u, {"character", "-", "character", "GroupSet"}}, // 17
        {"CharSet",                  "CharSet",  1u, {"character"}                              }, // 18
        {"CharSetChar",              "CharSet",  2u, {"CharSet", "character"}                   }  // 19
    };

    std::vector<Production> productions;

    // Create productions
    for (size_t i = 0u; i < productionCount; ++i) {
        unsigned arr[4];
        // Convert names into integers
        for (size_t j = 0u; j < 4u; ++j)
            if (init[i].pRight[j])
                arr[j] = grammarSymbols[init[i].pRight[j]];
        // Add production
        Production p{init[i].pName, grammarSymbols[init[i].pSymbol], arr, init[i].Length};
        productions.push_back(p);
    }

    // And initialize grammar
    grammar.Clear();
    grammar.AddGrammarSymbols(grammarSymbols);
    grammar.AddProductions(productions);
}